

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arf_freq_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_149450a::ArfFreqTestLarge::PreEncodeFrameHook
          (ArfFreqTestLarge *this,VideoSource *video,Encoder *encoder)

{
  int iVar1;
  
  iVar1 = (*video->_vptr_VideoSource[8])(video);
  if (iVar1 == 0) {
    libaom_test::Encoder::Control(encoder,0x25,1);
    libaom_test::Encoder::Control(encoder,0x21,4);
    libaom_test::Encoder::Control(encoder,0xd,(this->test_encode_param_).cpu_used);
    libaom_test::Encoder::Control(encoder,0x31,this->min_arf_requested_);
    if ((this->test_encode_param_).mode != kRealTime) {
      libaom_test::Encoder::Control(encoder,0xe,1);
      libaom_test::Encoder::Control(encoder,0x15,7);
      libaom_test::Encoder::Control(encoder,0x16,5);
      return;
    }
  }
  return;
}

Assistant:

void PreEncodeFrameHook(::libaom_test::VideoSource *video,
                          ::libaom_test::Encoder *encoder) override {
    if (video->frame() == 0) {
      encoder->Control(AV1E_SET_FRAME_PARALLEL_DECODING, 1);
      encoder->Control(AV1E_SET_TILE_COLUMNS, 4);
      encoder->Control(AOME_SET_CPUUSED, test_encode_param_.cpu_used);
      encoder->Control(AV1E_SET_MIN_GF_INTERVAL, min_arf_requested_);
      if (test_encode_param_.mode != ::libaom_test::kRealTime) {
        encoder->Control(AOME_SET_ENABLEAUTOALTREF, 1);
        encoder->Control(AOME_SET_ARNR_MAXFRAMES, 7);
        encoder->Control(AOME_SET_ARNR_STRENGTH, 5);
      }
    }
  }